

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O1

mat4 * __thiscall Camera::GetViewMatrix(mat4 *__return_storage_ptr__,Camera *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  fVar9 = (this->Position).field_0.x;
  fVar8 = (this->Position).field_1.y;
  fVar10 = (this->Position).field_2.z;
  fVar9 = ((this->Front).field_0.x + fVar9) - fVar9;
  fVar8 = ((this->Front).field_1.y + fVar8) - fVar8;
  fVar10 = ((this->Front).field_2.z + fVar10) - fVar10;
  fVar3 = fVar10 * fVar10 + fVar8 * fVar8 + fVar9 * fVar9;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar3 = 1.0 / fVar3;
  fVar9 = fVar9 * fVar3;
  fVar8 = fVar8 * fVar3;
  fVar10 = fVar10 * fVar3;
  fVar3 = (this->Up).field_2.z;
  fVar7 = (this->Up).field_0.x;
  fVar1 = (this->Up).field_1.y;
  fVar11 = fVar8 * fVar3 - fVar10 * fVar1;
  fVar12 = fVar10 * fVar7 - fVar3 * fVar9;
  fVar7 = fVar1 * fVar9 - fVar7 * fVar8;
  fVar3 = fVar7 * fVar7 + fVar12 * fVar12 + fVar11 * fVar11;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar3 = 1.0 / fVar3;
  fVar11 = fVar11 * fVar3;
  fVar12 = fVar12 * fVar3;
  fVar3 = fVar3 * fVar7;
  fVar4 = fVar12 * fVar10 - fVar3 * fVar8;
  fVar5 = fVar3 * fVar9 - fVar11 * fVar10;
  fVar6 = fVar11 * fVar8 - fVar12 * fVar9;
  __return_storage_ptr__->value[3].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  __return_storage_ptr__->value[3].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  __return_storage_ptr__->value[3].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  __return_storage_ptr__->value[3].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
  __return_storage_ptr__->value[0].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  __return_storage_ptr__->value[0].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  __return_storage_ptr__->value[0].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  __return_storage_ptr__->value[0].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
  __return_storage_ptr__->value[1].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  __return_storage_ptr__->value[1].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  __return_storage_ptr__->value[1].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  __return_storage_ptr__->value[1].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
  __return_storage_ptr__->value[2].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  __return_storage_ptr__->value[2].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  __return_storage_ptr__->value[2].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  __return_storage_ptr__->value[2].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
  __return_storage_ptr__->value[3].field_3.w = 1.0;
  __return_storage_ptr__->value[0].field_0.x = fVar11;
  __return_storage_ptr__->value[1].field_0.x = fVar12;
  __return_storage_ptr__->value[2].field_0.x = fVar3;
  __return_storage_ptr__->value[0].field_1.y = fVar4;
  __return_storage_ptr__->value[1].field_1.y = fVar5;
  __return_storage_ptr__->value[2].field_1.y = fVar6;
  __return_storage_ptr__->value[0].field_2.z = -fVar9;
  __return_storage_ptr__->value[1].field_2.z = -fVar8;
  __return_storage_ptr__->value[2].field_2.z = -fVar10;
  fVar7 = (this->Position).field_0.x;
  fVar1 = (this->Position).field_1.y;
  fVar2 = (this->Position).field_2.z;
  __return_storage_ptr__->value[3].field_0.x = -(fVar3 * fVar2 + fVar12 * fVar1 + fVar11 * fVar7);
  __return_storage_ptr__->value[3].field_1.y = -(fVar6 * fVar2 + fVar5 * fVar1 + fVar4 * fVar7);
  __return_storage_ptr__->value[3].field_2.z = fVar10 * fVar2 + fVar8 * fVar1 + fVar9 * fVar7;
  return __return_storage_ptr__;
}

Assistant:

glm::mat4 GetViewMatrix() const {
        return glm::lookAt(this->Position, this->Position + this->Front, this->Up);
    }